

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_creation_date(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_col *puVar1;
  Sytm *pTm;
  undefined1 auStack_50 [4];
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 1) {
    jx9_context_throw_error(pCtx,1,"Missing collection name");
    jx9_result_bool(pCtx,0);
  }
  else {
    _auStack_50 = jx9_value_to_string(*argv,(int *)((long)&pTm + 4));
    if (pTm._4_4_ < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_bool(pCtx,0);
    }
    else {
      sName.zString._0_4_ = pTm._4_4_;
      sName._8_8_ = jx9_context_user_data(pCtx);
      puVar1 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)auStack_50,4);
      if (puVar1 == (unqlite_col *)0x0) {
        jx9_result_bool(pCtx,0);
      }
      else {
        jx9_result_string_format
                  (pCtx,"%d-%d-%d %02d:%02d:%02d",(ulong)(uint)(puVar1->sCreation).tm_year,
                   (ulong)(uint)(puVar1->sCreation).tm_mon,(ulong)(uint)(puVar1->sCreation).tm_mday,
                   (ulong)(uint)(puVar1->sCreation).tm_hour,(puVar1->sCreation).tm_min,
                   (puVar1->sCreation).tm_sec);
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_creation_date(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		Sytm *pTm = &pCol->sCreation;
		jx9_result_string_format(pCtx,"%d-%d-%d %02d:%02d:%02d",
			pTm->tm_year,pTm->tm_mon,pTm->tm_mday,
			pTm->tm_hour,pTm->tm_min,pTm->tm_sec
			);
	}else{
		/* No such collection */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}